

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.hpp
# Opt level: O1

void njoy::ENDFtk::record::Zipper::
     process<njoy::ENDFtk::record::Zipper::Zipped<njoy::ENDFtk::record::Real>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,double,double,double,double,double,double>
               (ReadingPack<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                pack,double *references,double *references_1,double *references_2,
               double *references_3,double *references_4,double *references_5)

{
  double dVar1;
  int local_44;
  int local_40;
  TailVerification<0,njoy::ENDFtk::record::TailVerification<1,njoy::ENDFtk::record::TailVerification<2,njoy::ENDFtk::record::Tail>>>
  local_3c [12];
  
  dVar1 = tools::disco::Real<11u>::
          read<double,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                    (pack.it,pack.end);
  *references = dVar1;
  tools::disco::
  Record<njoy::tools::disco::ENDF,njoy::tools::disco::ENDF,njoy::tools::disco::ENDF,njoy::tools::disco::ENDF,njoy::tools::disco::ENDF,njoy::tools::disco::Column<0u>,njoy::tools::disco::RetainCarriage>
  ::
  read<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,double,double,double,double,double>
            (pack.it,pack.end,references_1,references_2,references_3,references_4,references_5);
  local_40 = pack.MF;
  local_44 = pack.MT;
  TailVerification<0,njoy::ENDFtk::record::TailVerification<1,njoy::ENDFtk::record::TailVerification<2,njoy::ENDFtk::record::Tail>>>
  ::
  TailVerification<int&,int&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,long&>
            (local_3c,pack.MAT,&local_40,&local_44,pack.it,pack.end,pack.lineNumber);
  return;
}

Assistant:

static void
process( ReadingPack< Iterator > pack, References&... references ){
  Zip::Format::read( pack.it, pack.end, references... );
  verifyTail( pack.it, pack.end, pack.lineNumber,
              pack.MAT, pack.MF, pack.MT );
}